

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c++
# Opt level: O0

void * kj::_::HeapArrayDisposer::allocateImpl
                 (size_t elementSize,size_t elementCount,size_t capacity,
                 _func_void_void_ptr *constructElement,_func_void_void_ptr *destroyElement)

{
  void *pvVar1;
  undefined1 local_70 [8];
  ExceptionSafeArrayUtil guard;
  byte *local_40;
  byte *pos;
  AutoDeleter result;
  _func_void_void_ptr *destroyElement_local;
  _func_void_void_ptr *constructElement_local;
  size_t capacity_local;
  size_t elementCount_local;
  size_t elementSize_local;
  
  result.ptr = destroyElement;
  pvVar1 = operator_new(elementSize * capacity);
  AutoDeleter::AutoDeleter((AutoDeleter *)&pos,pvVar1);
  if (constructElement != (_func_void_void_ptr *)0x0) {
    if (result.ptr == (void *)0x0) {
      local_40 = pos;
      for (capacity_local = elementCount; capacity_local != 0; capacity_local = capacity_local - 1)
      {
        (*constructElement)(local_40);
        local_40 = local_40 + elementSize;
      }
    }
    else {
      ExceptionSafeArrayUtil::ExceptionSafeArrayUtil
                ((ExceptionSafeArrayUtil *)local_70,pos,elementSize,0,
                 (_func_void_void_ptr *)result.ptr);
      ExceptionSafeArrayUtil::construct
                ((ExceptionSafeArrayUtil *)local_70,elementCount,constructElement);
      ExceptionSafeArrayUtil::release((ExceptionSafeArrayUtil *)local_70);
      ExceptionSafeArrayUtil::~ExceptionSafeArrayUtil((ExceptionSafeArrayUtil *)local_70);
    }
  }
  pvVar1 = AutoDeleter::release((AutoDeleter *)&pos);
  AutoDeleter::~AutoDeleter((AutoDeleter *)&pos);
  return pvVar1;
}

Assistant:

void* HeapArrayDisposer::allocateImpl(size_t elementSize, size_t elementCount, size_t capacity,
                                      void (*constructElement)(void*),
                                      void (*destroyElement)(void*)) {
  AutoDeleter result(operator new(elementSize * capacity));

  if (constructElement == nullptr) {
    // Nothing to do.
  } else if (destroyElement == nullptr) {
    byte* pos = reinterpret_cast<byte*>(result.ptr);
    while (elementCount > 0) {
      constructElement(pos);
      pos += elementSize;
      --elementCount;
    }
  } else {
    ExceptionSafeArrayUtil guard(result.ptr, elementSize, 0, destroyElement);
    guard.construct(elementCount, constructElement);
    guard.release();
  }

  return result.release();
}